

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

bool __thiscall
Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ensure(DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t s)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    uVar6 = uVar1 * 2;
    if (uVar1 * 2 <= s) {
      uVar6 = s;
    }
    uVar5 = uVar6 << 5;
    if (uVar5 == 0) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar5 < 0x21) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar5 < 0x31) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar5 < 0x41) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::operator_new(uVar5,0x10);
    }
    paVar4 = &pbVar3->field_2;
    uVar5 = uVar6;
    do {
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar4 + -1))->
      _M_dataplus)._M_p = (pointer)paVar4;
      *(size_type *)((long)paVar4 + -8) = 0;
      paVar4->_M_local_buf[0] = '\0';
      paVar4 = paVar4 + 2;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    if (this->_array != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      array_delete<std::__cxx11::string>(this->_array,this->_capacity);
      pbVar2 = this->_array;
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        uVar5 = this->_capacity << 5;
        if (uVar5 == 0) {
          (pbVar2->_M_dataplus)._M_p = (pointer)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pbVar2;
        }
        else if (uVar5 < 0x21) {
          (pbVar2->_M_dataplus)._M_p = (pointer)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pbVar2;
        }
        else if (uVar5 < 0x31) {
          (pbVar2->_M_dataplus)._M_p = (pointer)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pbVar2;
        }
        else if (uVar5 < 0x41) {
          (pbVar2->_M_dataplus)._M_p = (pointer)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pbVar2;
        }
        else {
          operator_delete(pbVar2,0x10);
        }
      }
    }
    this->_size = s;
    this->_capacity = uVar6;
    this->_array = pbVar3;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }